

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

void __thiscall ON_SubDHeap::Return3dPointArray(ON_SubDHeap *this,ON_3dPoint *point_array)

{
  uint uVar1;
  size_t sVar2;
  
  if ((point_array != (ON_3dPoint *)0x0) &&
     (uVar1 = *(uint *)&point_array[-1].z, 0xffff0011 < uVar1 - 0xfff1)) {
    sVar2 = ON_FixedSizePool::SizeofElement(&this->m_fsp17);
    if (sVar2 < (ulong)uVar1 * 0x18 + 8) {
      onfree(&point_array[-1].z);
      return;
    }
    ON_FixedSizePool::ReturnElement(&this->m_fsp17,&point_array[-1].z);
    return;
  }
  ON_SubDIncrementErrorCount();
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_heap.cpp"
             ,0x662,"","point_array is not valid");
  return;
}

Assistant:

unsigned int ON_SubDHeap::Managed3dPointArrayCapacity(class ON_3dPoint* point_array)
{
  const unsigned int point_capacity =
    (nullptr != point_array)
    ? *((unsigned int*)(((const double*)point_array)-1))
    : 0;
  return (point_capacity >= 3 && point_capacity <= ON_SubDFace::MaximumEdgeCount) ? point_capacity : 0;
}